

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  ImVec2 IVar1;
  byte bVar2;
  bool bVar3;
  char *pcVar4;
  ImGuiOldColumns *pIVar5;
  char *pcVar6;
  char *unaff_RBX;
  char *windows;
  ImGuiWindow *in_RSI;
  ImGuiWindow *in_RDI;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *label_00;
  bool bVar12;
  ImGuiOldColumns *columns;
  ImGuiOldColumns *__end2;
  ImGuiOldColumns *__begin2;
  ImVector<ImGuiOldColumns> *__range2;
  int layer_1;
  ImVec2 *pr;
  ImRect r;
  int layer;
  ImGuiWindowFlags flags;
  bool open;
  ImGuiTreeNodeFlags tree_node_flags;
  bool is_active;
  ImGuiContext *g;
  char *in_stack_00000248;
  ImDrawList *in_stack_00000250;
  ImGuiViewportP *in_stack_00000258;
  ImGuiWindow *in_stack_00000260;
  ImVec2 *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  int count;
  ImVec4 *in_stack_ffffffffffffff28;
  ImGuiHoveredFlags flags_00;
  undefined8 in_stack_ffffffffffffff30;
  ImGuiOldColumns *columns_00;
  float in_stack_ffffffffffffff3c;
  ImGuiStorage *in_stack_ffffffffffffff40;
  float local_b8;
  uint local_b0;
  ImDrawList *in_stack_ffffffffffffff60;
  ImGuiOldColumns *local_80;
  float in_stack_ffffffffffffff90;
  ImDrawFlags in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  ImVec2 *pIVar13;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  float fVar14;
  undefined4 in_stack_ffffffffffffffa8;
  float fVar15;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  float fVar16;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar17;
  ImGuiContext *label_01;
  
  count = (int)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  if (in_RDI == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",in_RSI);
  }
  else {
    bVar2 = in_RDI->WasActive & 1;
    bVar12 = in_RDI == GImGui->NavWindow;
    label_01 = GImGui;
    if (bVar2 == 0) {
      GetStyleColorVec4(1);
      PushStyleColor((ImGuiCol)((ulong)in_stack_ffffffffffffff30 >> 0x20),in_stack_ffffffffffffff28)
      ;
    }
    flags_00 = (ImGuiHoveredFlags)in_stack_ffffffffffffff30;
    pcVar8 = " *Inactive*";
    if (bVar2 != 0) {
      pcVar8 = "";
    }
    bVar12 = TreeNodeEx((char *)in_RSI,(ImGuiTreeNodeFlags)(ulong)bVar12,"%s \'%s\'%s",in_RSI,
                        in_RDI->Name,pcVar8);
    if (bVar2 == 0) {
      PopStyleColor(count);
    }
    bVar3 = IsItemHovered(flags_00);
    if ((bVar3) && (bVar2 != 0)) {
      in_stack_ffffffffffffff60 = GetForegroundDrawList((ImGuiWindow *)0x20ab2e);
      ::operator+(in_stack_ffffffffffffff08,(ImVec2 *)0x20ab50);
      ImDrawList::AddRect((ImDrawList *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (ImU32)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                          (float)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                          in_stack_ffffffffffffff90);
    }
    if (bVar12) {
      if ((in_RDI->MemoryCompacted & 1U) != 0) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      if ((((label_01->IO).ConfigDebugIsDebuggerPresent & 1U) != 0) &&
         (bVar12 = DebugBreakButton(unaff_RBX,(char *)in_RDI), bVar12)) {
        label_01->DebugBreakInWindow = in_RDI->ID;
      }
      uVar17 = in_RDI->Flags;
      DebugNodeDrawList(in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248);
      BulletText((char *)(double)(in_RDI->Pos).x,(double)(in_RDI->Pos).y,(double)(in_RDI->Size).x,
                 (double)(in_RDI->Size).y,(double)(in_RDI->ContentSize).x,
                 (double)(in_RDI->ContentSize).y,(double)(in_RDI->ContentSizeIdeal).x,
                 (double)(in_RDI->ContentSizeIdeal).y,
                 "Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)");
      pcVar8 = "";
      if ((uVar17 & 0x1000000) != 0) {
        pcVar8 = "Child ";
      }
      pcVar6 = "";
      if ((uVar17 & 0x2000000) != 0) {
        pcVar6 = "Tooltip ";
      }
      pcVar7 = "";
      if ((uVar17 & 0x4000000) != 0) {
        pcVar7 = "Popup ";
      }
      pcVar9 = "";
      if ((uVar17 & 0x8000000) != 0) {
        pcVar9 = "Modal ";
      }
      label_00 = "";
      if ((uVar17 & 0x10000000) != 0) {
        label_00 = "ChildMenu ";
      }
      windows = "";
      if ((uVar17 & 0x100) != 0) {
        windows = "NoSavedSettings ";
      }
      pcVar11 = "";
      if ((uVar17 & 0x200) != 0) {
        pcVar11 = "NoMouseInputs";
      }
      pcVar10 = "";
      if ((uVar17 & 0x10000) != 0) {
        pcVar10 = "NoNavInputs";
      }
      pcVar4 = "";
      if ((uVar17 & 0x40) != 0) {
        pcVar4 = "AlwaysAutoResize";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar17,pcVar8,pcVar6,pcVar7,pcVar9,
                 label_00,windows,pcVar11,pcVar10,pcVar4);
      if ((uVar17 & 0x1000000) != 0) {
        pcVar8 = "";
        if ((in_RDI->ChildFlags & 1U) != 0) {
          pcVar8 = "Border ";
        }
        pcVar6 = "";
        if ((in_RDI->ChildFlags & 4U) != 0) {
          pcVar6 = "ResizeX ";
        }
        pcVar7 = "";
        if ((in_RDI->ChildFlags & 8U) != 0) {
          pcVar7 = "ResizeY ";
        }
        pcVar9 = "";
        if ((in_RDI->ChildFlags & 0x100U) != 0) {
          pcVar9 = "NavFlattened ";
        }
        BulletText("ChildFlags: 0x%08X (%s%s%s%s..)",(ulong)(uint)in_RDI->ChildFlags,pcVar8,pcVar6,
                   pcVar7,pcVar9,label_00,windows,pcVar11,pcVar10,pcVar4);
      }
      pcVar8 = "";
      if ((in_RDI->ScrollbarX & 1U) != 0) {
        pcVar8 = "X";
      }
      pcVar6 = "";
      if ((in_RDI->ScrollbarY & 1U) != 0) {
        pcVar6 = "Y";
      }
      BulletText((char *)(double)(in_RDI->Scroll).x,(double)(in_RDI->ScrollMax).x,
                 (double)(in_RDI->Scroll).y,(double)(in_RDI->ScrollMax).y,
                 "Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",pcVar8,pcVar6);
      if (((in_RDI->Active & 1U) == 0) && ((in_RDI->WasActive & 1U) == 0)) {
        local_b0 = 0xffffffff;
      }
      else {
        local_b0 = (uint)in_RDI->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)(in_RDI->Active & 1),(ulong)(in_RDI->WasActive & 1),
                 (ulong)(in_RDI->WriteAccessed & 1),(ulong)local_b0);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)(in_RDI->Appearing & 1),(ulong)(in_RDI->Hidden & 1),
                 (ulong)(uint)(int)in_RDI->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)in_RDI->HiddenFramesCannotSkipItems,
                 (ulong)(in_RDI->SkipItems & 1),label_00,windows,pcVar11,pcVar10,pcVar4);
      for (uVar17 = 0; (int)uVar17 < 2; uVar17 = uVar17 + 1) {
        IVar1 = in_RDI->NavRectRel[(int)uVar17].Min;
        fVar14 = IVar1.x;
        fVar15 = IVar1.y;
        IVar1 = in_RDI->NavRectRel[(int)uVar17].Max;
        fVar16 = IVar1.y;
        if ((fVar14 < fVar16) || (fVar15 < fVar16)) {
          BulletText((char *)(double)fVar14,(double)fVar15,(double)IVar1.x,(double)fVar16,
                     "NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(ulong)uVar17,
                     (ulong)in_RDI->NavLastIds[(int)uVar17]);
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",(ulong)uVar17,(ulong)in_RDI->NavLastIds[(int)uVar17]);
        }
        DebugLocateItemOnHover((ImGuiID)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      }
      pIVar13 = in_RDI->NavPreferredScoringPosRel;
      for (uVar17 = 0; (int)uVar17 < 2; uVar17 = uVar17 + 1) {
        if ((pIVar13[(int)uVar17].x != 3.4028235e+38) || (NAN(pIVar13[(int)uVar17].x))) {
          local_b8 = pIVar13[(int)uVar17].x;
        }
        else {
          local_b8 = -99999.0;
        }
        in_stack_ffffffffffffff40 = (ImGuiStorage *)(double)local_b8;
        if ((pIVar13[(int)uVar17].y != 3.4028235e+38) || (NAN(pIVar13[(int)uVar17].y))) {
          in_stack_ffffffffffffff3c = pIVar13[(int)uVar17].y;
        }
        else {
          in_stack_ffffffffffffff3c = -99999.0;
        }
        BulletText((char *)in_stack_ffffffffffffff40,(double)in_stack_ffffffffffffff3c,
                   "NavPreferredScoringPosRel[%d] = {%.1f,%.1f)",(ulong)uVar17);
      }
      uVar17 = (uint)(in_RDI->DC).NavLayersActiveMask;
      if (in_RDI->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        columns_00 = (ImGuiOldColumns *)0x2b2b9a;
      }
      else {
        columns_00 = (ImGuiOldColumns *)in_RDI->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",(ulong)uVar17,columns_00);
      if (in_RDI->RootWindow != in_RDI) {
        DebugNodeWindow(in_RSI,&label_01->Initialized);
      }
      if (in_RDI->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(in_RSI,&label_01->Initialized);
      }
      if (in_RDI->ParentWindowForFocusRoute != (ImGuiWindow *)0x0) {
        DebugNodeWindow(in_RSI,&label_01->Initialized);
      }
      if (0 < (in_RDI->DC).ChildWindows.Size) {
        DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)windows,label_00);
      }
      if ((0 < (in_RDI->ColumnsStorage).Size) &&
         (bVar12 = TreeNode("Columns","Columns sets (%d)",(ulong)(uint)(in_RDI->ColumnsStorage).Size
                           ), bVar12)) {
        local_80 = ImVector<ImGuiOldColumns>::begin(&in_RDI->ColumnsStorage);
        pIVar5 = ImVector<ImGuiOldColumns>::end(&in_RDI->ColumnsStorage);
        for (; local_80 != pIVar5; local_80 = local_80 + 1) {
          DebugNodeColumns(columns_00);
        }
        TreePop();
      }
      DebugNodeStorage(in_stack_ffffffffffffff40,(char *)CONCAT44(in_stack_ffffffffffffff3c,uVar17))
      ;
      TreePop();
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    if (g.IO.ConfigDebugIsDebuggerPresent && DebugBreakButton("**DebugBreak**", "in Begin()"))
        g.DebugBreakInWindow = window->ID;

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->Viewport, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    if (flags & ImGuiWindowFlags_ChildWindow)
        BulletText("ChildFlags: 0x%08X (%s%s%s%s..)", window->ChildFlags,
            (window->ChildFlags & ImGuiChildFlags_Border) ? "Border " : "",
            (window->ChildFlags & ImGuiChildFlags_ResizeX) ? "ResizeX " : "",
            (window->ChildFlags & ImGuiChildFlags_ResizeY) ? "ResizeY " : "",
            (window->ChildFlags & ImGuiChildFlags_NavFlattened) ? "NavFlattened " : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
        else
            BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        DebugLocateItemOnHover(window->NavLastIds[layer]);
    }
    const ImVec2* pr = window->NavPreferredScoringPosRel;
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
        BulletText("NavPreferredScoringPosRel[%d] = {%.1f,%.1f)", layer, (pr[layer].x == FLT_MAX ? -99999.0f : pr[layer].x), (pr[layer].y == FLT_MAX ? -99999.0f : pr[layer].y)); // Display as 99999.0f so it looks neater.
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)               { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)               { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->ParentWindowForFocusRoute != NULL)  { DebugNodeWindow(window->ParentWindowForFocusRoute, "ParentWindowForFocusRoute"); }
    if (window->DC.ChildWindows.Size > 0)           { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (ImGuiOldColumns& columns : window->ColumnsStorage)
            DebugNodeColumns(&columns);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}